

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O0

bool __thiscall ON_Polyline::IsClosed(ON_Polyline *this,double tolerance)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_24;
  int i;
  int count;
  bool rc;
  double tolerance_local;
  ON_Polyline *this_local;
  
  iVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count + -1;
  if (2 < iVar2) {
    if (tolerance <= 0.0) {
      bVar1 = ON_PointsAreCoincident
                        (3,false,&((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.
                                  m_a)->x,
                         &(this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a[iVar2].
                          x);
      if (bVar1) {
        for (local_24 = 1; local_24 < iVar2; local_24 = local_24 + 1) {
          bVar1 = ON_PointsAreCoincident
                            (3,false,&(this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>
                                      .m_a[local_24].x,
                             &((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a)->
                              x);
          if ((!bVar1) &&
             (bVar1 = ON_PointsAreCoincident
                                (3,false,&(this->super_ON_3dPointArray).
                                          super_ON_SimpleArray<ON_3dPoint>.m_a[local_24].x,
                                 &(this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a
                                  [iVar2].x), !bVar1)) {
            return true;
          }
        }
      }
    }
    else {
      dVar3 = ON_3dPoint::DistanceTo
                        ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a,
                         (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + iVar2)
      ;
      if (dVar3 <= tolerance) {
        for (local_24 = 1; local_24 < iVar2; local_24 = local_24 + 1) {
          dVar3 = ON_3dPoint::DistanceTo
                            ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
                             local_24,(this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>
                                      .m_a);
          if ((tolerance < dVar3) &&
             (dVar3 = ON_3dPoint::DistanceTo
                                ((this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a
                                 + local_24,
                                 (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a
                                 + iVar2), tolerance < dVar3)) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Polyline::IsClosed( double tolerance ) const
{
  bool rc = false;
  const int count = m_count-1;
  int i;
  if ( count >= 3 )
  {
    if ( tolerance > 0.0 )
    {
      if ( m_a[0].DistanceTo(m_a[count]) <= tolerance ) {
        for ( i = 1; i < count; i++ ) {
          if (   m_a[i].DistanceTo(m_a[0]) > tolerance 
              && m_a[i].DistanceTo(m_a[count]) > tolerance ) 
          {
             rc = true;
             break;
          }
        }
      }
    }
    else
    {
      if ( ON_PointsAreCoincident(3,false,&m_a[0].x,&m_a[count].x) ) 
      {
        for ( i = 1; i < count; i++ ) {
          if (    !ON_PointsAreCoincident(3,false,&m_a[i].x,&m_a[0].x) 
               && !ON_PointsAreCoincident(3,false,&m_a[i].x,&m_a[count].x) 
             )
          {
            rc = true;
            break;
          }
        }
      }
    }
  }
  return rc;
}